

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O0

void __thiscall
QHttp2ProtocolHandler::_q_uploadDataDestroyed(QHttp2ProtocolHandler *this,QObject *uploadData)

{
  long lVar1;
  bool bVar2;
  QHttp2Stream *this_00;
  long in_FS_OFFSET;
  QPointer<QHttp2Stream> stream;
  Http2Error in_stack_0000003c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QObject_*,_QPointer<QHttp2Stream>_>::take
            ((QHash<QObject_*,_QPointer<QHttp2Stream>_> *)0xaaaaaaaaaaaaaaaa,
             (QObject **)0xaaaaaaaaaaaaaaaa);
  bVar2 = QPointer::operator_cast_to_bool((QPointer<QHttp2Stream> *)0x2d1098);
  if (bVar2) {
    this_00 = QPointer<QHttp2Stream>::operator->((QPointer<QHttp2Stream> *)0x2d10a8);
    bVar2 = QHttp2Stream::isActive((QHttp2Stream *)this_00);
    if (bVar2) {
      QPointer<QHttp2Stream>::operator->((QPointer<QHttp2Stream> *)0x2d10c0);
      QHttp2Stream::sendRST_STREAM((QHttp2Stream *)stream.wp.d,in_stack_0000003c);
    }
  }
  QPointer<QHttp2Stream>::~QPointer((QPointer<QHttp2Stream> *)0x2d10d7);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttp2ProtocolHandler::_q_uploadDataDestroyed(QObject *uploadData)
{
    QPointer<QHttp2Stream> stream = streamIDs.take(uploadData);
    if (stream && stream->isActive())
        stream->sendRST_STREAM(CANCEL);
}